

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

Aig_Man_t *
Saig_ManUnrollWithCex(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,Vec_Int_t **pvMapPiF2A)

{
  int Level;
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Vec_t *p;
  void **ppvVar7;
  undefined8 *puVar8;
  void *__ptr;
  Aig_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Aig_Obj_t *pAVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  Aig_Obj_t *p1;
  long lVar16;
  uint uVar17;
  char *__assertion;
  ulong uVar18;
  ulong uVar19;
  int local_58;
  
  if (pAig->nTruePis != pCex->nPis) {
    __assert_fail("Saig_ManPiNum(pAig) == pCex->nPis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x111,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  if (pAig->nRegs != pCex->nRegs) {
    __assertion = "Saig_ManRegNum(pAig) == pCex->nRegs";
    pcVar10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
    ;
    pcVar15 = "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)";
LAB_0058df1f:
    __assert_fail(__assertion,pcVar10,0x112,pcVar15);
  }
  iVar12 = pCex->iPo;
  if (((long)iVar12 < 0) || (pAig->nTruePos <= iVar12)) {
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x113,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar5->pArray = piVar6;
  *pvMapPiF2A = pVVar5;
  Level = pCex->iFrame;
  uVar17 = Level + 1;
  p = (Vec_Vec_t *)malloc(0x10);
  uVar4 = 8;
  if (6 < (ulong)(long)Level) {
    uVar4 = uVar17;
  }
  p->nSize = 0;
  p->nCap = uVar4;
  if (uVar4 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)(int)uVar4 * 8);
  }
  p->pArray = ppvVar7;
  uVar19 = (ulong)uVar17;
  if (-1 < Level) {
    uVar18 = 0;
    do {
      puVar8 = (undefined8 *)malloc(0x10);
      *puVar8 = 0;
      puVar8[1] = 0;
      ppvVar7[uVar18] = puVar8;
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  p->nSize = uVar17;
  if (uVar4 == 0) {
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc((long)(int)uVar4 << 3);
  }
  if (-1 < Level) {
    uVar18 = 0;
    do {
      puVar8 = (undefined8 *)malloc(0x10);
      *puVar8 = 0;
      puVar8[1] = 0;
      *(undefined8 **)((long)__ptr + uVar18 * 8) = puVar8;
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  if (iVar12 < pAig->vCos->nSize) {
    Vec_VecPushInt(p,Level,*(int *)((long)pAig->vCos->pArray[iVar12] + 0x24));
    lVar14 = (long)pCex->iFrame;
    if (-1 < (long)pCex->iFrame) {
      do {
        Aig_ManIncrementTravId(pAig);
        if (p->nSize <= lVar14) goto LAB_0058dead;
        ppvVar7 = p->pArray;
        pvVar1 = ppvVar7[lVar14];
        if (0 < *(int *)((long)pvVar1 + 4)) {
          lVar16 = 0;
          do {
            pVVar2 = pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              pAVar11 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar4 = *(uint *)(*(long *)((long)pvVar1 + 8) + lVar16 * 4);
              if (((int)uVar4 < 0) || (pVVar2->nSize <= (int)uVar4)) goto LAB_0058de8e;
              pAVar11 = (Aig_Obj_t *)pVVar2->pArray[uVar4];
            }
            if (Level < lVar14) goto LAB_0058dead;
            if (lVar14 == 0) {
              pVVar5 = (Vec_Int_t *)0x0;
            }
            else {
              pVVar5 = (Vec_Int_t *)ppvVar7[lVar14 + -1];
            }
            Saig_ManUnrollCollect_rec(pAig,pAVar11,*(Vec_Int_t **)((long)__ptr + lVar14 * 8),pVVar5)
            ;
            lVar16 = lVar16 + 1;
          } while (lVar16 < *(int *)((long)pvVar1 + 4));
        }
        bVar3 = 0 < lVar14;
        lVar14 = lVar14 + -1;
      } while (bVar3);
    }
    p_00 = Aig_ManStart(10000);
    pcVar15 = pAig->pName;
    if (pcVar15 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      sVar9 = strlen(pcVar15);
      pcVar10 = (char *)malloc(sVar9 + 1);
      strcpy(pcVar10,pcVar15);
    }
    p_00->pName = pcVar10;
    pcVar15 = pAig->pSpec;
    if (pcVar15 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      sVar9 = strlen(pcVar15);
      pcVar10 = (char *)malloc(sVar9 + 1);
      strcpy(pcVar10,pcVar15);
    }
    p_00->pSpec = pcVar10;
    if (0 < pAig->nRegs) {
      uVar4 = 0;
      do {
        uVar17 = pAig->nTruePis + uVar4;
        if (((int)uVar17 < 0) || (pAig->vCis->nSize <= (int)uVar17)) goto LAB_0058de8e;
        *(ulong *)((long)pAig->vCis->pArray[uVar17] + 0x28) =
             (ulong)(((uint)(&pCex[1].iPo)[uVar4 >> 5] >> (uVar4 & 0x1f) & 1) == 0) ^
             (ulong)p_00->pConst1;
        uVar4 = uVar4 + 1;
      } while ((int)uVar4 < pAig->nRegs);
    }
    if (-1 < pCex->iFrame) {
      iVar12 = -1;
      if (-1 < Level) {
        iVar12 = Level;
      }
      uVar18 = 0;
      do {
        if (uVar18 == iVar12 + 1) {
LAB_0058dead:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        lVar14 = *(long *)((long)__ptr + uVar18 * 8);
        if (0 < *(int *)(lVar14 + 4)) {
          lVar16 = 0;
          do {
            pVVar2 = pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              piVar6 = (int *)0x0;
            }
            else {
              uVar4 = *(uint *)(*(long *)(lVar14 + 8) + lVar16 * 4);
              if (((int)uVar4 < 0) || (pVVar2->nSize <= (int)uVar4)) goto LAB_0058de8e;
              piVar6 = (int *)pVVar2->pArray[uVar4];
            }
            uVar4 = ((uint)*(undefined8 *)(piVar6 + 6) & 7) - 7;
            if (uVar4 < 0xfffffffe) {
              uVar17 = (uint)*(undefined8 *)(piVar6 + 6) & 7;
              if (uVar17 == 3) {
                if (((ulong)piVar6 & 1) != 0) goto LAB_0058deeb;
                uVar13 = *(ulong *)(piVar6 + 2) & 0xfffffffffffffffe;
                if (uVar13 == 0) {
                  pAVar11 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar11 = (Aig_Obj_t *)
                            ((ulong)((uint)*(ulong *)(piVar6 + 2) & 1) ^ *(ulong *)(uVar13 + 0x28));
                }
                goto LAB_0058dc01;
              }
              if (((ulong)piVar6 & 1) != 0) {
                __assertion = "!Aig_IsComplement(pObj)";
                pcVar10 = 
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                ;
                pcVar15 = "int Aig_ObjIsConst1(Aig_Obj_t *)";
                goto LAB_0058df1f;
              }
              if (uVar17 == 2) {
                if (*piVar6 < pAig->nTruePis) {
                  if (0xfffffffd < uVar4) {
LAB_0058df29:
                    __assert_fail("!Aig_ObjIsNode(pObj)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                                  ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
                  }
                  local_58 = (int)uVar18;
                  if (*piVar6 < nInputs) {
                    uVar4 = *piVar6 + pCex->nRegs + pCex->nPis * local_58;
                    *(ulong *)(piVar6 + 10) =
                         (ulong)(((uint)(&pCex[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) == 0)
                         ^ (ulong)p_00->pConst1;
                  }
                  else {
                    pAVar11 = Aig_ObjCreateCi(p_00);
                    *(Aig_Obj_t **)(piVar6 + 10) = pAVar11;
                    if (0xfffffffd < (piVar6[6] & 7U) - 7) goto LAB_0058df29;
                    Vec_IntPush(*pvMapPiF2A,*piVar6);
                    Vec_IntPush(*pvMapPiF2A,local_58);
                  }
                }
              }
              else if (uVar17 == 1) {
                pAVar11 = p_00->pConst1;
                goto LAB_0058dc01;
              }
            }
            else {
              if (((ulong)piVar6 & 1) != 0) {
LAB_0058deeb:
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                              ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
              }
              uVar13 = *(ulong *)(piVar6 + 2) & 0xfffffffffffffffe;
              if (uVar13 == 0) {
                pAVar11 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar11 = (Aig_Obj_t *)
                          ((ulong)((uint)*(ulong *)(piVar6 + 2) & 1) ^ *(ulong *)(uVar13 + 0x28));
              }
              uVar13 = *(ulong *)(piVar6 + 4) & 0xfffffffffffffffe;
              if (uVar13 == 0) {
                p1 = (Aig_Obj_t *)0x0;
              }
              else {
                p1 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)(piVar6 + 4) & 1) ^ *(ulong *)(uVar13 + 0x28));
              }
              pAVar11 = Aig_And(p_00,pAVar11,p1);
LAB_0058dc01:
              *(Aig_Obj_t **)(piVar6 + 10) = pAVar11;
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < *(int *)(lVar14 + 4));
        }
        if (uVar18 == (uint)pCex->iFrame) break;
        if ((long)p->nSize <= (long)uVar18) goto LAB_0058dead;
        pvVar1 = p->pArray[uVar18];
        if (0 < *(int *)((long)pvVar1 + 4)) {
          lVar14 = 0;
          do {
            pVVar2 = pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              piVar6 = (int *)0x0;
            }
            else {
              uVar4 = *(uint *)(*(long *)((long)pvVar1 + 8) + lVar14 * 4);
              if (((int)uVar4 < 0) || (pVVar2->nSize <= (int)uVar4)) goto LAB_0058de8e;
              piVar6 = (int *)pVVar2->pArray[uVar4];
            }
            if (((piVar6[6] & 7U) != 3) || (*piVar6 < pAig->nTruePos)) {
              __assert_fail("Saig_ObjIsLi(p, pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                            ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
            }
            uVar4 = (*piVar6 - pAig->nTruePos) + pAig->nTruePis;
            if (((int)uVar4 < 0) || (pAig->vCis->nSize <= (int)uVar4)) goto LAB_0058de8e;
            *(undefined8 *)((long)pAig->vCis->pArray[uVar4] + 0x28) = *(undefined8 *)(piVar6 + 10);
            lVar14 = lVar14 + 1;
          } while (lVar14 < *(int *)((long)pvVar1 + 4));
        }
        bVar3 = (long)uVar18 < (long)pCex->iFrame;
        uVar18 = uVar18 + 1;
      } while (bVar3);
    }
    iVar12 = pCex->iPo;
    if ((-1 < (long)iVar12) && (iVar12 < pAig->vCos->nSize)) {
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)(*(ulong *)((long)pAig->vCos->pArray[iVar12] + 0x28) ^ 1));
      Aig_ManSetRegNum(p_00,0);
      iVar12 = p->nSize;
      if (0 < (long)iVar12) {
        ppvVar7 = p->pArray;
        lVar14 = 0;
        do {
          pvVar1 = ppvVar7[lVar14];
          if (pvVar1 != (void *)0x0) {
            if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar1 + 8));
              *(undefined8 *)((long)pvVar1 + 8) = 0;
            }
            free(pvVar1);
          }
          lVar14 = lVar14 + 1;
        } while (iVar12 != lVar14);
      }
      if (p->pArray != (void **)0x0) {
        free(p->pArray);
        p->pArray = (void **)0x0;
      }
      free(p);
      if (-1 < Level) {
        uVar18 = 0;
        do {
          pvVar1 = *(void **)((long)__ptr + uVar18 * 8);
          if (pvVar1 != (void *)0x0) {
            if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar1 + 8));
              *(undefined8 *)((long)pvVar1 + 8) = 0;
            }
            free(pvVar1);
          }
          uVar18 = uVar18 + 1;
        } while (uVar19 != uVar18);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      Aig_ManCleanup(p_00);
      return p_00;
    }
  }
LAB_0058de8e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManUnrollWithCex( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, Vec_Int_t ** pvMapPiF2A )
{
    Aig_Man_t * pFrames;     // unrolled timeframes
    Vec_Vec_t * vFrameCos;   // the list of COs per frame
    Vec_Vec_t * vFrameObjs;  // the list of objects per frame
    Vec_Int_t * vRoots, * vObjs;
    Aig_Obj_t * pObj;
    int i, f;
    // sanity checks
    assert( Saig_ManPiNum(pAig) == pCex->nPis );
    assert( Saig_ManRegNum(pAig) == pCex->nRegs );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );

    // map PIs of the unrolled frames into PIs of the original design
    *pvMapPiF2A = Vec_IntAlloc( 1000 );

    // collect COs and Objs visited in each frame
    vFrameCos  = Vec_VecStart( pCex->iFrame+1 );
    vFrameObjs = Vec_VecStart( pCex->iFrame+1 );
    // initialized the topmost frame
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Vec_VecPushInt( vFrameCos, pCex->iFrame, Aig_ObjId(pObj) );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManUnrollCollect_rec( pAig, pObj, 
                Vec_VecEntryInt(vFrameObjs, f),
                (Vec_Int_t *)(f ? Vec_VecEntry(vFrameCos, f-1) : NULL) );
    }

    // derive unrolled timeframes
    pFrames = Aig_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // initialize the flops 
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, i) );
    // iterate through the frames
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // construct
        vObjs = Vec_VecEntryInt( vFrameObjs, f );
        Aig_ManForEachObjVec( vObjs, pAig, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) )
                pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else if ( Aig_ObjIsCo(pObj) )
                pObj->pData = Aig_ObjChild0Copy(pObj);
            else if ( Aig_ObjIsConst1(pObj) )
                pObj->pData = Aig_ManConst1(pFrames);
            else if ( Saig_ObjIsPi(pAig, pObj) )
            {
                if ( Aig_ObjCioId(pObj) < nInputs )
                {
                    int iBit = pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj);
                    pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, iBit) );
                }
                else
                {
                    pObj->pData = Aig_ObjCreateCi( pFrames );
                    Vec_IntPush( *pvMapPiF2A, Aig_ObjCioId(pObj) );
                    Vec_IntPush( *pvMapPiF2A, f );
                }
            }
        }
        if ( f == pCex->iFrame )
            break;
        // transfer
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ObjLiToLo( pAig, pObj )->pData = pObj->pData;
    }
    // create output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Aig_ObjCreateCo( pFrames, Aig_Not((Aig_Obj_t *)pObj->pData) );
    Aig_ManSetRegNum( pFrames, 0 );
    // cleanup
    Vec_VecFree( vFrameCos );
    Vec_VecFree( vFrameObjs );
    // finallize
    Aig_ManCleanup( pFrames );
    // return
    return pFrames;
}